

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ddict.c
# Opt level: O0

size_t ZSTD_loadEntropy_intoDDict(ZSTD_DDict *ddict,ZSTD_dictContentType_e dictContentType)

{
  U32 UVar1;
  uint uVar2;
  size_t code;
  size_t errcod;
  U32 magic;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_DDict *ddict_local;
  
  ddict->dictID = 0;
  ddict->entropyPresent = 0;
  if (dictContentType == ZSTD_dct_rawContent) {
    ddict_local = (ZSTD_DDict *)0x0;
  }
  else if (ddict->dictSize < 8) {
    if (dictContentType == ZSTD_dct_fullDict) {
      ddict_local = (ZSTD_DDict *)0xffffffffffffffe2;
    }
    else {
      ddict_local = (ZSTD_DDict *)0x0;
    }
  }
  else {
    UVar1 = MEM_readLE32(ddict->dictContent);
    if (UVar1 == 0xec30a437) {
      UVar1 = MEM_readLE32((void *)((long)ddict->dictContent + 4));
      ddict->dictID = UVar1;
      code = ZSTD_loadDEntropy(&ddict->entropy,ddict->dictContent,ddict->dictSize);
      uVar2 = ERR_isError(code);
      if (uVar2 == 0) {
        ddict->entropyPresent = 1;
        ddict_local = (ZSTD_DDict *)0x0;
      }
      else {
        ddict_local = (ZSTD_DDict *)0xffffffffffffffe2;
      }
    }
    else if (dictContentType == ZSTD_dct_fullDict) {
      ddict_local = (ZSTD_DDict *)0xffffffffffffffe2;
    }
    else {
      ddict_local = (ZSTD_DDict *)0x0;
    }
  }
  return (size_t)ddict_local;
}

Assistant:

static size_t
ZSTD_loadEntropy_intoDDict(ZSTD_DDict* ddict,
                           ZSTD_dictContentType_e dictContentType)
{
    ddict->dictID = 0;
    ddict->entropyPresent = 0;
    if (dictContentType == ZSTD_dct_rawContent) return 0;

    if (ddict->dictSize < 8) {
        if (dictContentType == ZSTD_dct_fullDict)
            return ERROR(dictionary_corrupted);   /* only accept specified dictionaries */
        return 0;   /* pure content mode */
    }
    {   U32 const magic = MEM_readLE32(ddict->dictContent);
        if (magic != ZSTD_MAGIC_DICTIONARY) {
            if (dictContentType == ZSTD_dct_fullDict)
                return ERROR(dictionary_corrupted);   /* only accept specified dictionaries */
            return 0;   /* pure content mode */
        }
    }
    ddict->dictID = MEM_readLE32((const char*)ddict->dictContent + ZSTD_FRAMEIDSIZE);

    /* load entropy tables */
    CHECK_E( ZSTD_loadDEntropy(&ddict->entropy,
                                ddict->dictContent, ddict->dictSize),
             dictionary_corrupted );
    ddict->entropyPresent = 1;
    return 0;
}